

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void notch::core::SGD::train
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Net *net,LabeledDataset *trainSet,int epochs,EpochCallback *epochCallback,
               IterationCallback *sampleCallback)

{
  bool bVar1;
  LabeledData LVar2;
  Array *local_98;
  LabeledData sample;
  DatasetIterator __end3;
  DatasetIterator __begin3;
  LabeledDataset *__range3;
  int sampleCounter;
  int j;
  IterationCallback *sampleCallback_local;
  EpochCallback *epochCallback_local;
  int epochs_local;
  LabeledDataset *trainSet_local;
  Net *net_local;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *rng_local;
  
  __range3._4_4_ = 0;
  while( true ) {
    if (epochs <= __range3._4_4_) {
      EpochCallback::operator()(epochCallback,epochs,true);
      return;
    }
    bVar1 = EpochCallback::operator()(epochCallback,__range3._4_4_,false);
    if (bVar1) break;
    LabeledDataset::shuffle(trainSet,rng);
    __range3._0_4_ = 0;
    LabeledDataset::begin((DatasetIterator *)&__end3.out_end,trainSet);
    LabeledDataset::end((DatasetIterator *)&sample.label,trainSet);
    while (bVar1 = LabeledDataset::DatasetIterator::operator!=
                             ((DatasetIterator *)&__end3.out_end,(DatasetIterator *)&sample.label),
          bVar1) {
      LVar2 = LabeledDataset::DatasetIterator::operator*((DatasetIterator *)&__end3.out_end);
      local_98 = LVar2.data;
      sample.data = LVar2.label;
      Net::loss(net,local_98,sample.data);
      Net::backprop(net);
      Net::update(net);
      bVar1 = IterationCallback::operator()(sampleCallback,(int)__range3,false);
      if (bVar1) {
        return;
      }
      __range3._0_4_ = (int)__range3 + 1;
      LabeledDataset::DatasetIterator::operator++((DatasetIterator *)&__end3.out_end);
    }
    __range3._4_4_ = __range3._4_4_ + 1;
  }
  return;
}

Assistant:

static
    void train(std::unique_ptr<RNG> &rng,
            Net &net, LabeledDataset &trainSet, int epochs,
            const EpochCallback &epochCallback = noEpochCallback,
            const IterationCallback &sampleCallback = noIterationCallback) {
        for (int j = 0; j < epochs; ++j) {
            if (epochCallback(j)) {
                return;
            }
            trainSet.shuffle(rng);
            int sampleCounter = 0;
            for (auto sample : trainSet) {
                net.loss(sample.data, sample.label);
                net.backprop();
                net.update();
                if (sampleCallback(sampleCounter)) {
                    return;
                }
                ++sampleCounter;
            }
        }
        epochCallback(epochs, true);
    }